

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

void __thiscall
TPZCompElHCurl<pzshape::TPZShapePrism>::RestrainSide
          (TPZCompElHCurl<pzshape::TPZShapePrism> *this,int side,TPZInterpolatedElement *large,
          int neighbourside)

{
  double dVar1;
  TPZFMatrix<double> *pTVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 uVar7;
  int iVar8;
  ostream *poVar9;
  undefined4 extraout_var;
  TPZConnect *pTVar10;
  TPZGeoEl *pTVar11;
  void *pvVar12;
  double *pdVar13;
  int64_t jpos_00;
  int in_ECX;
  TPZCompEl *in_RDX;
  int in_ESI;
  TPZCompEl *in_RDI;
  double dVar14;
  int64_t jnodindex_1;
  int jn_4;
  TPZDepend *depend;
  int64_t jnodindex;
  int jn_3;
  int in;
  int64_t ndepend;
  int64_t inodindex;
  TPZConnect *inod;
  int64_t jpos;
  int64_t ipos;
  int j;
  int i;
  int jbl;
  int jn_2;
  int ibl;
  int in_4;
  TPZFNMatrix<20,_double> blocknorm;
  uint nshape_1;
  TPZConnect *c_2;
  int locid_1;
  int in_3;
  uint nshape;
  TPZConnect *c_1;
  int locid;
  int in_2;
  TPZBlock MBlocklarge;
  TPZBlock MBlocksmall;
  int largeNumSideNodes;
  int thisNumSideNodes;
  TPZStepSolver<double> MSolve;
  int iaxes_1;
  REAL dotProduct_1;
  int jn_1;
  int iaxes;
  REAL dotProduct;
  int jn;
  int in_1;
  int it;
  TPZFNMatrix<100,_double> largeTrace;
  TPZFNMatrix<100,_double> thisTrace;
  TPZFNMatrix<100,_double> dphil;
  TPZFNMatrix<100,_double> phil;
  TPZFNMatrix<100,_double> dphis;
  TPZFNMatrix<100,_double> phis;
  REAL weight;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> jac;
  TPZVec<double> centerPoint;
  REAL detjac;
  TPZManVector<double,_3> pointl;
  TPZManVector<double,_3> par;
  TPZFNMatrix<1000,_double> *M;
  TPZFNMatrix<1000,_double> MSL;
  int numshapel;
  int numshape;
  int numint;
  TPZIntPoints *intrule;
  uchar sideOrder;
  int largeOrder;
  int sideord;
  TPZConnect *c;
  int sidecon;
  int maxord;
  int nSideConnects;
  TPZTransform<double> t;
  TPZConnect *myConnect;
  int connectLocId;
  TPZInterpolatedElement *largeCel;
  int largeSideDimension;
  int thisSideDimension;
  TPZGeoElSide largeGeoSide;
  TPZGeoElSide thisGeoSide;
  TPZCompElSide largeCompSide;
  TPZCompElSide thisCompSide;
  int in_stack_ffffffffffffbc48;
  DecomposeType in_stack_ffffffffffffbc4c;
  int in_stack_ffffffffffffbc50;
  int in_stack_ffffffffffffbc54;
  TPZGeoEl *in_stack_ffffffffffffbc58;
  TPZVec<double> *in_stack_ffffffffffffbc60;
  undefined4 in_stack_ffffffffffffbc68;
  int in_stack_ffffffffffffbc6c;
  TPZFNMatrix<100,_double> *in_stack_ffffffffffffbc70;
  undefined4 in_stack_ffffffffffffbc78;
  undefined4 in_stack_ffffffffffffbc7c;
  TPZTransform<double> *in_stack_ffffffffffffbc80;
  undefined4 in_stack_ffffffffffffbc88;
  int in_stack_ffffffffffffbc8c;
  TPZFNMatrix<1000,_double> *in_stack_ffffffffffffbc90;
  undefined8 in_stack_ffffffffffffbd30;
  undefined4 in_stack_ffffffffffffbd38;
  undefined4 in_stack_ffffffffffffbd3c;
  TPZBlock *in_stack_ffffffffffffbd40;
  uint local_4188;
  undefined4 in_stack_ffffffffffffbee8;
  TPZFMatrix<double> *in_stack_ffffffffffffbef0;
  TPZFMatrix<double> *in_stack_ffffffffffffbef8;
  TPZStepSolver<double> *in_stack_ffffffffffffbf00;
  int local_40cc;
  int local_40b8;
  long local_40b0;
  long in_stack_ffffffffffffbf68;
  TPZFMatrix<double> *in_stack_ffffffffffffbf70;
  int in_stack_ffffffffffffbf78;
  int in_stack_ffffffffffffbf7c;
  int in_stack_ffffffffffffbf80;
  int in_stack_ffffffffffffbf84;
  int in_stack_ffffffffffffbf88;
  int iVar15;
  int in_stack_ffffffffffffbfa0;
  int in_stack_ffffffffffffbfa8;
  TPZVec<double> *in_stack_ffffffffffffbff8;
  TPZGeoElSide *in_stack_ffffffffffffc000;
  size_t in_stack_ffffffffffffc068;
  char *in_stack_ffffffffffffc070;
  int local_3f18;
  int local_3f04;
  int local_3c4c;
  double local_3c48;
  int local_3c40;
  int local_3c3c;
  double local_3c38;
  int local_3c2c;
  int local_3c28;
  int local_3c24;
  undefined1 local_3c20 [480];
  TPZTransform<double> *in_stack_ffffffffffffc5c0;
  TPZGeoElSide *in_stack_ffffffffffffc5c8;
  TPZGeoElSide *in_stack_ffffffffffffc5d0;
  undefined1 local_3868 [192];
  TPZFMatrix<double> *in_stack_ffffffffffffc858;
  REAL *in_stack_ffffffffffffc860;
  TPZFMatrix<double> *in_stack_ffffffffffffc868;
  TPZFMatrix<double> *in_stack_ffffffffffffc870;
  TPZVec<double> *in_stack_ffffffffffffc878;
  TPZGeoElSide *in_stack_ffffffffffffc880;
  undefined1 local_34b0 [1904];
  undefined1 local_2d40 [1904];
  double local_25d0 [85];
  undefined8 local_2328;
  undefined1 local_22f8 [56];
  undefined1 local_22c0 [56];
  undefined8 local_2288;
  void *local_2280;
  undefined8 local_2278;
  int local_294;
  int local_290;
  int local_28c;
  long *local_288;
  byte local_279;
  int local_278;
  uint local_274;
  TPZConnect *local_270;
  int local_264;
  uint local_260;
  int local_25c;
  TPZConnect *local_a0;
  int local_98;
  undefined4 local_94;
  TPZFMatrix<double> *local_90;
  int local_84;
  int local_80;
  TPZCompElSide local_40;
  TPZCompElSide local_30;
  int local_1c;
  TPZCompEl *local_18;
  int local_c;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  TPZCompElSide::TPZCompElSide(&local_30,in_RDI,in_ESI);
  TPZCompElSide::TPZCompElSide(&local_40,local_18,local_1c);
  TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffbc58);
  TPZGeoElSide::TPZGeoElSide
            ((TPZGeoElSide *)in_stack_ffffffffffffbc60,in_stack_ffffffffffffbc58,
             in_stack_ffffffffffffbc54);
  TPZCompElSide::Reference
            ((TPZCompElSide *)CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68));
  local_80 = TPZGeoElSide::Dimension
                       ((TPZGeoElSide *)
                        CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50));
  local_84 = TPZGeoElSide::Dimension
                       ((TPZGeoElSide *)
                        CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50));
  local_90 = (TPZFMatrix<double> *)0x0;
  iVar4 = TPZCompElSide::Exists(&local_40);
  if (iVar4 != 0) {
    in_stack_ffffffffffffbf00 = (TPZStepSolver<double> *)TPZCompElSide::Element(&local_40);
    if (in_stack_ffffffffffffbf00 == (TPZStepSolver<double> *)0x0) {
      in_stack_ffffffffffffbef8 = (TPZFMatrix<double> *)0x0;
      local_90 = in_stack_ffffffffffffbef8;
    }
    else {
      in_stack_ffffffffffffbef8 =
           (TPZFMatrix<double> *)
           __dynamic_cast(in_stack_ffffffffffffbf00,&TPZCompEl::typeinfo,
                          &TPZInterpolatedElement::typeinfo,0);
      local_90 = in_stack_ffffffffffffbef8;
    }
  }
  if (local_90 == (TPZFMatrix<double> *)0x0) {
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "Exiting RestrainSide - null computational element.");
    std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    local_94 = 1;
  }
  else {
    iVar4 = (**(code **)(*(long *)in_RDI + 0x310))(in_RDI,local_c);
    local_98 = iVar4;
    if (iVar4 < 0) {
      pzinternal::DebugStopImpl(in_stack_ffffffffffffc070,in_stack_ffffffffffffc068);
    }
    local_a0 = (TPZConnect *)(**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,local_98);
    uVar5 = TPZConnect::NShape(local_a0);
    if (uVar5 == 0) {
      local_94 = 1;
    }
    else {
      iVar6 = TPZConnect::HasDependency(local_a0);
      if ((iVar6 != 0) && (0 < local_84)) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "RestrainSide - unnecessary call to restrainside");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        pzinternal::DebugStopImpl(in_stack_ffffffffffffc070,in_stack_ffffffffffffc068);
      }
      pTVar2 = local_90;
      uVar5 = TPZCompElSide::Side(&local_40);
      uVar5 = (*(pTVar2->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x62])(pTVar2,(ulong)uVar5);
      iVar6 = (*(pTVar2->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x14])(pTVar2,(ulong)uVar5);
      if (CONCAT44(extraout_var,iVar6) == -1) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "Exiting RestrainSide - Side of large element not initialized");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        pzinternal::DebugStopImpl(in_stack_ffffffffffffc070,in_stack_ffffffffffffc068);
        local_94 = 1;
      }
      else if (local_84 == 0) {
        poVar9 = std::operator<<((ostream *)&std::cout,
                                 "Exiting RestrainSide - dimension of large element is 0");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        pzinternal::DebugStopImpl(in_stack_ffffffffffffc070,in_stack_ffffffffffffc068);
        local_94 = 1;
      }
      else {
        TPZTransform<double>::TPZTransform
                  ((TPZTransform<double> *)in_stack_ffffffffffffbc90,in_stack_ffffffffffffbc8c);
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                   (TPZGeoElSide *)CONCAT44(in_stack_ffffffffffffbc4c,in_stack_ffffffffffffbc48));
        TPZGeoElSide::SideTransform3
                  (in_stack_ffffffffffffc5d0,in_stack_ffffffffffffc5c8,in_stack_ffffffffffffc5c0);
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1bed002);
        local_25c = (**(code **)(*(long *)in_RDI + 0x248))(in_RDI,local_c);
        local_260 = 1;
        for (local_264 = 0; local_264 < local_25c; local_264 = local_264 + 1) {
          local_270 = TPZInterpolatedElement::SideConnect
                                ((TPZInterpolatedElement *)
                                 CONCAT44(in_stack_ffffffffffffbc7c,in_stack_ffffffffffffbc78),
                                 (int)((ulong)in_stack_ffffffffffffbc70 >> 0x20),
                                 (int)in_stack_ffffffffffffbc70);
          bVar3 = TPZConnect::Order(local_270);
          local_274 = (uint)bVar3;
          local_4188 = local_274;
          if ((int)local_274 <= (int)local_260) {
            local_4188 = local_260;
          }
          local_260 = local_4188;
        }
        local_278 = (**(code **)(*(long *)local_18 + 0x338))(local_18,local_1c);
        pTVar10 = (TPZConnect *)(**(code **)(*(long *)in_RDI + 0x318))(in_RDI,local_c);
        local_279 = TPZConnect::Order(pTVar10);
        if ((((int)(uint)local_279 < local_278) && (local_80 != 0)) && (local_84 != 0)) {
          pzinternal::DebugStopImpl(in_stack_ffffffffffffc070,in_stack_ffffffffffffc068);
        }
        pTVar11 = TPZCompEl::Reference((TPZCompEl *)in_stack_ffffffffffffbc58);
        local_288 = (long *)(**(code **)(*(long *)pTVar11 + 0x70))(pTVar11,local_c,local_260 * 2);
        if (local_288 == (long *)0x0) {
          poVar9 = std::operator<<((ostream *)&std::cout,
                                   "Exiting RestrainSide - cannot create side integration rule");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          local_94 = 1;
        }
        else {
          local_28c = (**(code **)(*local_288 + 0x18))();
          local_290 = TPZInterpolatedElement::NSideShapeF
                                ((TPZInterpolatedElement *)in_stack_ffffffffffffbc70,
                                 in_stack_ffffffffffffbc6c);
          local_294 = TPZInterpolatedElement::NSideShapeF
                                ((TPZInterpolatedElement *)in_stack_ffffffffffffbc70,
                                 in_stack_ffffffffffffbc6c);
          local_2278 = 0;
          TPZFNMatrix<1000,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffbc90,
                     CONCAT44(in_stack_ffffffffffffbc8c,in_stack_ffffffffffffbc88),
                     (int64_t)in_stack_ffffffffffffbc80,
                     (double *)CONCAT44(in_stack_ffffffffffffbc7c,in_stack_ffffffffffffbc78));
          pvVar12 = operator_new(0x1fd8);
          local_2288 = 0;
          TPZFNMatrix<1000,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffbc90,
                     CONCAT44(in_stack_ffffffffffffbc8c,in_stack_ffffffffffffbc88),
                     (int64_t)in_stack_ffffffffffffbc80,
                     (double *)CONCAT44(in_stack_ffffffffffffbc7c,in_stack_ffffffffffffbc78));
          local_2280 = pvVar12;
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffbc70,
                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68));
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_ffffffffffffbc70,
                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68));
          local_2328 = 0;
          TPZVec<double>::TPZVec
                    (in_stack_ffffffffffffbc60,(int64_t)in_stack_ffffffffffffbc58,
                     (double *)CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50));
          TPZGeoElSide::CenterPoint(in_stack_ffffffffffffc000,in_stack_ffffffffffffbff8);
          TPZFNMatrix<9,_double>::TPZFNMatrix
                    ((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffbc70,
                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                     (int64_t)in_stack_ffffffffffffbc60);
          TPZFNMatrix<9,_double>::TPZFNMatrix
                    ((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffbc70,
                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                     (int64_t)in_stack_ffffffffffffbc60);
          TPZFNMatrix<9,_double>::TPZFNMatrix
                    ((TPZFNMatrix<9,_double> *)in_stack_ffffffffffffbc70,
                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                     (int64_t)in_stack_ffffffffffffbc60);
          TPZGeoElSide::Jacobian
                    (in_stack_ffffffffffffc880,in_stack_ffffffffffffc878,in_stack_ffffffffffffc870,
                     in_stack_ffffffffffffc868,in_stack_ffffffffffffc860,in_stack_ffffffffffffc858);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffbc70,
                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                     (int64_t)in_stack_ffffffffffffbc60);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffbc70,
                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                     (int64_t)in_stack_ffffffffffffbc60);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffbc70,
                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                     (int64_t)in_stack_ffffffffffffbc60);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffbc70,
                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                     (int64_t)in_stack_ffffffffffffbc60);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffbc70,
                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                     (int64_t)in_stack_ffffffffffffbc60);
          TPZFNMatrix<100,_double>::TPZFNMatrix
                    (in_stack_ffffffffffffbc70,
                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                     (int64_t)in_stack_ffffffffffffbc60);
          for (local_3c24 = 0; local_3c24 < local_28c; local_3c24 = local_3c24 + 1) {
            (**(code **)(*local_288 + 0x20))(local_288,local_3c24,local_22c0,local_25d0);
            (**(code **)(*(long *)in_RDI + 0x288))(in_RDI,local_c,local_22c0,local_3868,local_2d40);
            TPZTransform<double>::Apply
                      (in_stack_ffffffffffffbc80,
                       (TPZVec<double> *)
                       CONCAT44(in_stack_ffffffffffffbc7c,in_stack_ffffffffffffbc78),
                       (TPZVec<double> *)in_stack_ffffffffffffbc70);
            (**(code **)(*(long *)local_18 + 0x288))
                      (local_18,local_1c,local_22f8,local_3c20,local_34b0);
            for (local_3c28 = 0; local_3c28 < local_290; local_3c28 = local_3c28 + 1) {
              for (local_3c2c = 0; local_3c2c < local_290; local_3c2c = local_3c2c + 1) {
                local_3c38 = 0.0;
                for (local_3c3c = 0; dVar14 = local_25d0[0], local_3c3c < 3;
                    local_3c3c = local_3c3c + 1) {
                  pdVar13 = TPZFMatrix<double>::operator()
                                      (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                       CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68)
                                       ,(int64_t)in_stack_ffffffffffffbc60);
                  dVar14 = *pdVar13;
                  pdVar13 = TPZFMatrix<double>::operator()
                                      (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                       CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68)
                                       ,(int64_t)in_stack_ffffffffffffbc60);
                  local_3c38 = dVar14 * *pdVar13 + local_3c38;
                }
                pdVar13 = TPZFMatrix<double>::operator()
                                    (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                                     (int64_t)in_stack_ffffffffffffbc60);
                *pdVar13 = local_3c38 * dVar14 + *pdVar13;
              }
              for (local_3c40 = 0; local_3c40 < local_294; local_3c40 = local_3c40 + 1) {
                local_3c48 = 0.0;
                for (local_3c4c = 0; dVar14 = local_25d0[0], local_3c4c < 3;
                    local_3c4c = local_3c4c + 1) {
                  pdVar13 = TPZFMatrix<double>::operator()
                                      (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                       CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68)
                                       ,(int64_t)in_stack_ffffffffffffbc60);
                  dVar14 = *pdVar13;
                  pdVar13 = TPZFMatrix<double>::operator()
                                      (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                       CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68)
                                       ,(int64_t)in_stack_ffffffffffffbc60);
                  local_3c48 = dVar14 * *pdVar13 + local_3c48;
                }
                pdVar13 = TPZFMatrix<double>::operator()
                                    (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                                     (int64_t)in_stack_ffffffffffffbc60);
                *pdVar13 = local_3c48 * dVar14 + *pdVar13;
              }
            }
          }
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1bedadb);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1bedae8);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1bedaf5);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1bedb02);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1bedb0f);
          TPZFNMatrix<100,_double>::~TPZFNMatrix((TPZFNMatrix<100,_double> *)0x1bedb1c);
          TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1bedb29);
          TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1bedb36);
          TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1bedb43);
          TPZVec<double>::~TPZVec
                    ((TPZVec<double> *)CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50)
                    );
          TPZAutoPointer<TPZMatrix<double>>::TPZAutoPointer<TPZFNMatrix<1000,double>>
                    ((TPZAutoPointer<TPZMatrix<double>_> *)in_stack_ffffffffffffbc70,
                     (TPZFNMatrix<1000,_double> *)
                     CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68));
          TPZStepSolver<double>::TPZStepSolver
                    ((TPZStepSolver<double> *)in_stack_ffffffffffffbc90,
                     (TPZAutoPointer<TPZMatrix<double>_> *)
                     CONCAT44(in_stack_ffffffffffffbc8c,in_stack_ffffffffffffbc88));
          TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer
                    ((TPZAutoPointer<TPZMatrix<double>_> *)
                     CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50));
          TPZStepSolver<double>::SetDirect
                    ((TPZStepSolver<double> *)
                     CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                     in_stack_ffffffffffffbc4c);
          TPZStepSolver<double>::Solve
                    (in_stack_ffffffffffffbf00,in_stack_ffffffffffffbef8,in_stack_ffffffffffffbef0,
                     (TPZFMatrix<double> *)CONCAT44(iVar4,in_stack_ffffffffffffbee8));
          iVar4 = (**(code **)(*(long *)in_RDI + 0x248))(in_RDI,local_c);
          iVar6 = (**(code **)(*(long *)local_18 + 0x248))(local_18,local_1c);
          TPZBlock::TPZBlock(in_stack_ffffffffffffbd40,
                             (TPZBaseMatrix *)
                             CONCAT44(in_stack_ffffffffffffbd3c,in_stack_ffffffffffffbd38),
                             (int)((ulong)in_stack_ffffffffffffbd30 >> 0x20),
                             (int)in_stack_ffffffffffffbd30);
          TPZBlock::TPZBlock(in_stack_ffffffffffffbd40,
                             (TPZBaseMatrix *)
                             CONCAT44(in_stack_ffffffffffffbd3c,in_stack_ffffffffffffbd38),
                             (int)((ulong)in_stack_ffffffffffffbd30 >> 0x20),
                             (int)in_stack_ffffffffffffbd30);
          for (local_3f04 = 0; local_3f04 < iVar4; local_3f04 = local_3f04 + 1) {
            uVar7 = (**(code **)(*(long *)in_RDI + 0x250))(in_RDI,local_3f04,local_c);
            pTVar10 = (TPZConnect *)(**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,uVar7);
            TPZConnect::NShape(pTVar10);
            TPZBlock::Set((TPZBlock *)CONCAT44(in_stack_ffffffffffffbc7c,in_stack_ffffffffffffbc78),
                          (int)((ulong)in_stack_ffffffffffffbc70 >> 0x20),
                          (int)in_stack_ffffffffffffbc70,in_stack_ffffffffffffbc6c);
          }
          for (local_3f18 = 0; local_3f18 < iVar6; local_3f18 = local_3f18 + 1) {
            uVar7 = (**(code **)(*(long *)local_18 + 0x250))(local_18,local_3f18,local_1c);
            pTVar10 = (TPZConnect *)(**(code **)(*(long *)local_18 + 0xa8))(local_18,uVar7);
            TPZConnect::NShape(pTVar10);
            TPZBlock::Set((TPZBlock *)CONCAT44(in_stack_ffffffffffffbc7c,in_stack_ffffffffffffbc78),
                          (int)((ulong)in_stack_ffffffffffffbc70 >> 0x20),
                          (int)in_stack_ffffffffffffbc70,in_stack_ffffffffffffbc6c);
          }
          TPZBlock::Resequence
                    ((TPZBlock *)CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                     (int)((ulong)in_stack_ffffffffffffbc60 >> 0x20));
          TPZBlock::Resequence
                    ((TPZBlock *)CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                     (int)((ulong)in_stack_ffffffffffffbc60 >> 0x20));
          TPZFNMatrix<20,_double>::TPZFNMatrix
                    ((TPZFNMatrix<20,_double> *)in_stack_ffffffffffffbc90,
                     CONCAT44(in_stack_ffffffffffffbc8c,in_stack_ffffffffffffbc88),
                     (int64_t)in_stack_ffffffffffffbc80,
                     (double *)CONCAT44(in_stack_ffffffffffffbc7c,in_stack_ffffffffffffbc78));
          for (iVar15 = 0; iVar15 < iVar4; iVar15 = iVar15 + 1) {
            in_stack_ffffffffffffbf88 =
                 TPZBlock::Size((TPZBlock *)
                                CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                                in_stack_ffffffffffffbc4c);
            if (in_stack_ffffffffffffbf88 != 0) {
              for (in_stack_ffffffffffffbf84 = 0; in_stack_ffffffffffffbf84 < iVar6;
                  in_stack_ffffffffffffbf84 = in_stack_ffffffffffffbf84 + 1) {
                in_stack_ffffffffffffbf80 =
                     TPZBlock::Size((TPZBlock *)
                                    CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                                    in_stack_ffffffffffffbc4c);
                if (in_stack_ffffffffffffbf80 != 0) {
                  iVar8 = TPZBlock::Position((TPZBlock *)
                                             CONCAT44(in_stack_ffffffffffffbc54,
                                                      in_stack_ffffffffffffbc50),
                                             in_stack_ffffffffffffbc4c);
                  in_stack_ffffffffffffbf70 = (TPZFMatrix<double> *)(long)iVar8;
                  iVar8 = TPZBlock::Position((TPZBlock *)
                                             CONCAT44(in_stack_ffffffffffffbc54,
                                                      in_stack_ffffffffffffbc50),
                                             in_stack_ffffffffffffbc4c);
                  in_stack_ffffffffffffbf68 = (long)iVar8;
                  for (in_stack_ffffffffffffbf7c = 0;
                      in_stack_ffffffffffffbf7c < in_stack_ffffffffffffbf88;
                      in_stack_ffffffffffffbf7c = in_stack_ffffffffffffbf7c + 1) {
                    for (in_stack_ffffffffffffbf78 = 0;
                        in_stack_ffffffffffffbf78 < in_stack_ffffffffffffbf80;
                        in_stack_ffffffffffffbf78 = in_stack_ffffffffffffbf78 + 1) {
                      pdVar13 = TPZFMatrix<double>::operator()
                                          (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                           CONCAT44(in_stack_ffffffffffffbc6c,
                                                    in_stack_ffffffffffffbc68),
                                           (int64_t)in_stack_ffffffffffffbc60);
                      dVar14 = *pdVar13;
                      pdVar13 = TPZFMatrix<double>::operator()
                                          (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                           CONCAT44(in_stack_ffffffffffffbc6c,
                                                    in_stack_ffffffffffffbc68),
                                           (int64_t)in_stack_ffffffffffffbc60);
                      dVar1 = *pdVar13;
                      pdVar13 = TPZFMatrix<double>::operator()
                                          (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                           CONCAT44(in_stack_ffffffffffffbc6c,
                                                    in_stack_ffffffffffffbc68),
                                           (int64_t)in_stack_ffffffffffffbc60);
                      *pdVar13 = ABS(dVar14) * ABS(dVar1) + *pdVar13;
                    }
                  }
                  iVar8 = in_stack_ffffffffffffbf88 * in_stack_ffffffffffffbf80;
                  pdVar13 = TPZFMatrix<double>::operator()
                                      (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                       CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68)
                                       ,(int64_t)in_stack_ffffffffffffbc60);
                  *pdVar13 = *pdVar13 / (double)iVar8;
                  pdVar13 = TPZFMatrix<double>::operator()
                                      (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                       CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68)
                                       ,(int64_t)in_stack_ffffffffffffbc60);
                  dVar14 = sqrt(*pdVar13);
                  pdVar13 = TPZFMatrix<double>::operator()
                                      (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                       CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68)
                                       ,(int64_t)in_stack_ffffffffffffbc60);
                  *pdVar13 = dVar14;
                }
              }
            }
          }
          uVar7 = (**(code **)(*(long *)in_RDI + 0x310))(in_RDI,local_c);
          jpos_00 = (**(code **)(*(long *)in_RDI + 0xa8))(in_RDI,uVar7);
          uVar7 = (**(code **)(*(long *)in_RDI + 0x310))(in_RDI,local_c);
          (**(code **)(*(long *)in_RDI + 0xa0))(in_RDI,uVar7);
          local_40b0 = 0;
          for (local_40b8 = 0; local_40b8 < iVar6; local_40b8 = local_40b8 + 1) {
            iVar4 = TPZBlock::Size((TPZBlock *)
                                   CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                                   in_stack_ffffffffffffbc4c);
            if ((iVar4 != 0) &&
               (iVar4 = TPZBlock::Size((TPZBlock *)
                                       CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50)
                                       ,in_stack_ffffffffffffbc4c), iVar4 != 0)) {
              TPZInterpolatedElement::SideConnectIndex
                        ((TPZInterpolatedElement *)
                         CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                         in_stack_ffffffffffffbc4c,in_stack_ffffffffffffbc48);
              TPZBlock::Position((TPZBlock *)
                                 CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                                 in_stack_ffffffffffffbc4c);
              TPZBlock::Position((TPZBlock *)
                                 CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                                 in_stack_ffffffffffffbc4c);
              in_stack_ffffffffffffbc48 =
                   TPZBlock::Size((TPZBlock *)
                                  CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                                  in_stack_ffffffffffffbc4c);
              in_stack_ffffffffffffbc50 =
                   TPZBlock::Size((TPZBlock *)
                                  CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                                  in_stack_ffffffffffffbc4c);
              TPZConnect::AddDependency
                        ((TPZConnect *)CONCAT44(iVar15,in_stack_ffffffffffffbf88),
                         CONCAT44(in_stack_ffffffffffffbf84,in_stack_ffffffffffffbf80),
                         CONCAT44(in_stack_ffffffffffffbf7c,in_stack_ffffffffffffbf78),
                         in_stack_ffffffffffffbf70,in_stack_ffffffffffffbf68,jpos_00,
                         in_stack_ffffffffffffbfa0,in_stack_ffffffffffffbfa8);
              pdVar13 = TPZFMatrix<double>::operator()
                                  (&in_stack_ffffffffffffbc70->super_TPZFMatrix<double>,
                                   CONCAT44(in_stack_ffffffffffffbc6c,in_stack_ffffffffffffbc68),
                                   (int64_t)in_stack_ffffffffffffbc60);
              if (*pdVar13 <= 1e-08 && *pdVar13 != 1e-08) {
                TPZFMatrix<double>::Zero
                          ((TPZFMatrix<double> *)
                           CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50));
              }
              local_40b0 = local_40b0 + 1;
            }
          }
          if (local_40b0 == 0) {
            for (local_40cc = 0; local_40cc < iVar6; local_40cc = local_40cc + 1) {
              TPZInterpolatedElement::SideConnectIndex
                        ((TPZInterpolatedElement *)
                         CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                         in_stack_ffffffffffffbc4c,in_stack_ffffffffffffbc48);
              iVar4 = TPZBlock::Size((TPZBlock *)
                                     CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                                     in_stack_ffffffffffffbc4c);
              if (iVar4 != 0) {
                TPZBlock::Position((TPZBlock *)
                                   CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                                   in_stack_ffffffffffffbc4c);
                TPZBlock::Position((TPZBlock *)
                                   CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                                   in_stack_ffffffffffffbc4c);
                in_stack_ffffffffffffbc48 =
                     TPZBlock::Size((TPZBlock *)
                                    CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                                    in_stack_ffffffffffffbc4c);
                in_stack_ffffffffffffbc50 =
                     TPZBlock::Size((TPZBlock *)
                                    CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50),
                                    in_stack_ffffffffffffbc4c);
                TPZConnect::AddDependency
                          ((TPZConnect *)CONCAT44(iVar15,in_stack_ffffffffffffbf88),
                           CONCAT44(in_stack_ffffffffffffbf84,in_stack_ffffffffffffbf80),
                           CONCAT44(in_stack_ffffffffffffbf7c,in_stack_ffffffffffffbf78),
                           in_stack_ffffffffffffbf70,in_stack_ffffffffffffbf68,jpos_00,
                           in_stack_ffffffffffffbfa0,in_stack_ffffffffffffbfa8);
              }
            }
          }
          if (local_288 != (long *)0x0) {
            (**(code **)(*local_288 + 8))();
          }
          TPZFNMatrix<20,_double>::~TPZFNMatrix((TPZFNMatrix<20,_double> *)0x1bee800);
          TPZBlock::~TPZBlock((TPZBlock *)0x1bee80d);
          TPZBlock::~TPZBlock((TPZBlock *)0x1bee81a);
          TPZStepSolver<double>::~TPZStepSolver((TPZStepSolver<double> *)0x1bee827);
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)
                     CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50));
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)
                     CONCAT44(in_stack_ffffffffffffbc54,in_stack_ffffffffffffbc50));
          TPZFNMatrix<1000,_double>::~TPZFNMatrix((TPZFNMatrix<1000,_double> *)0x1bee84e);
          local_94 = 0;
        }
        TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x1bee866);
      }
    }
  }
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1bee873);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1bee880);
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::RestrainSide(int side, TPZInterpolatedElement *large, int neighbourside) {
    const TPZCompElSide thisCompSide(this, side);
    const TPZCompElSide largeCompSide(large, neighbourside);
    TPZGeoElSide thisGeoSide(this->Reference(), side);
    const TPZGeoElSide largeGeoSide = largeCompSide.Reference();
    const auto thisSideDimension = thisGeoSide.Dimension();
    const auto largeSideDimension = largeGeoSide.Dimension();


    TPZInterpolatedElement *largeCel = nullptr;
    if (largeCompSide.Exists()) largeCel = dynamic_cast<TPZInterpolatedElement *> (largeCompSide.Element());
    if (!largeCel) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - null computational element.");
        return;
    }
    const auto connectLocId = this->MidSideConnectLocId(side);
    if (connectLocId < 0) {
        DebugStop();
    }
    const TPZConnect &myConnect = this->Connect(connectLocId);
    if (myConnect.NShape() == 0) {
        /// no shape functions to restrain
        return;
    }
    if (myConnect.HasDependency() && largeSideDimension > 0) {
        LOGPZ_ERROR(logger, "RestrainSide - unnecessary call to restrainside");
        DebugStop();
    }
    if (largeCel->ConnectIndex(largeCel->MidSideConnectLocId(largeCompSide.Side())) == -1) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - Side of large element not initialized");
        DebugStop();
        return;
    }
    if (largeSideDimension == 0) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - dimension of large element is 0");
        DebugStop();
        return;
    }
    TPZTransform<> t(thisSideDimension);
    thisGeoSide.SideTransform3(largeGeoSide, t);
    const auto nSideConnects = NSideConnects(side);
    int maxord = 1;
    for (int sidecon = 0; sidecon < nSideConnects; sidecon++) {
        TPZConnect &c = this->SideConnect(sidecon, side);
        int sideord = c.Order();
        maxord = maxord < sideord ? sideord : maxord;
    }
    const auto largeOrder = large->EffectiveSideOrder(neighbourside);
    const auto sideOrder = this->MidSideConnect(side).Order();
    if (sideOrder < largeOrder && thisSideDimension && largeSideDimension) {
        DebugStop();
    }
    TPZIntPoints *intrule = this->Reference()->CreateSideIntegrationRule(side, maxord * 2);
    if (!intrule) {
        LOGPZ_ERROR(logger, "Exiting RestrainSide - cannot create side integration rule");
        return;
    }
    const auto numint = intrule->NPoints();
    const auto numshape = this->NSideShapeF(side);
    const auto numshapel = large->NSideShapeF(neighbourside);
    TPZFNMatrix<1000, REAL> MSL(numshape, numshapel, 0.);
    TPZFNMatrix<1000, REAL> *M = new TPZFNMatrix<1000, REAL>(numshape, numshape, 0.);
    TPZManVector<REAL, 3> par(thisSideDimension), pointl(largeSideDimension);

    {
        REAL detjac;
        TPZVec<REAL> centerPoint(thisSideDimension,0);
        thisGeoSide.CenterPoint(centerPoint);
        TPZFNMatrix<9,REAL> jac(thisSideDimension,thisSideDimension),jacinv(thisSideDimension,thisSideDimension),axes(thisSideDimension,3);
        thisGeoSide.Jacobian(centerPoint, jac, axes, detjac, jacinv);
        REAL weight;
        TPZFNMatrix<100, REAL> phis(numshape, 3), dphis(3, numshape), phil(numshapel, 3), dphil(3, numshapel);
        TPZFNMatrix<100, REAL> thisTrace(numshape, 3), largeTrace(numshapel, 3);
        for (int it = 0; it < numint; it++) {
            intrule->Point(it, par, weight);
            SideShapeFunction(side, par, thisTrace, dphis);
            t.Apply(par, pointl);
            large->SideShapeFunction(neighbourside, pointl, largeTrace, dphil);
            for (auto in = 0; in < numshape; in++) {
                for (auto jn = 0; jn < numshape; jn++) {
                    REAL dotProduct = 0;
                    for(auto iaxes = 0; iaxes < 3; iaxes ++){
                        dotProduct += thisTrace(in,iaxes) * thisTrace(jn,iaxes);
                    }
                    (*M)(in, jn) += dotProduct * weight;
                }
                for (auto jn = 0; jn < numshapel; jn++) {
                    REAL dotProduct = 0;
                    for(auto iaxes = 0; iaxes < 3; iaxes ++){
                        dotProduct += thisTrace(in,iaxes) * largeTrace(jn,iaxes);
                    }
                    MSL(in, jn) += dotProduct * weight;
                }
            }
        }
    }

#ifdef PZ_LOG_keep
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        M->Print("MSS = ", sout, EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    TPZStepSolver<REAL> MSolve(M);
    MSolve.SetDirect(ELU);

    MSolve.Solve(MSL, MSL);

    const auto thisNumSideNodes = NSideConnects(side);
    const auto largeNumSideNodes = large->NSideConnects(neighbourside);
    TPZBlock MBlocksmall(0, thisNumSideNodes), MBlocklarge(0, largeNumSideNodes);
    for (auto in = 0; in < thisNumSideNodes; in++) {
        int locid = SideConnectLocId(in, side);
        TPZConnect &c = this->Connect(locid);
#ifdef PZDEBUG
        if (NConnectShapeF(locid, c.Order()) != c.NShape()) {
            DebugStop();
        }
#endif
        unsigned int nshape = c.NShape();
        MBlocksmall.Set(in, nshape);
    }
    for (auto in = 0; in < largeNumSideNodes; in++) {
        int locid = large->SideConnectLocId(in, neighbourside);
        TPZConnect &c = large->Connect(locid);
        unsigned int nshape = c.NShape();
#ifdef PZDEBUG
        if (large->NConnectShapeF(locid, c.Order()) != nshape) {
            DebugStop();
        }
#endif
        MBlocklarge.Set(in, nshape);
    }

    MBlocksmall.Resequence();
    MBlocklarge.Resequence();
    TPZFNMatrix<20, REAL> blocknorm(thisNumSideNodes, largeNumSideNodes, 0.);
    for (auto in = 0; in < thisNumSideNodes; in++) {
        int ibl = MBlocksmall.Size(in);
        if (!ibl) continue;
        for (auto jn = 0; jn < largeNumSideNodes; jn++) {
            int jbl = MBlocklarge.Size(jn);
            if (!jbl) continue;
            int i, j;
            int64_t ipos = MBlocksmall.Position(in);
            int64_t jpos = MBlocklarge.Position(jn);
            for (i = 0; i < ibl; i++) for (j = 0; j < jbl; j++) blocknorm(in, jn) += fabs(MSL(ipos + i, jpos + j)) * fabs(MSL(ipos + i, jpos + j));
            blocknorm(in, jn) /= (ibl * jbl);
            blocknorm(in, jn) = sqrt(blocknorm(in, jn));
        }
    }
#ifdef PZDEBUG
    this->CheckConstraintConsistency(side);
#endif
    TPZConnect &inod = this->Connect(this->MidSideConnectLocId(side));
    const auto inodindex = ConnectIndex(this->MidSideConnectLocId(side));
    int64_t ndepend = 0;
    const auto in = thisNumSideNodes - 1;
#ifdef PZDEBUG
    if (MBlocksmall.Size(in) == 0) {
        DebugStop();
    }
#endif
    for (auto jn = 0; jn < largeNumSideNodes; jn++) {
        if (MBlocksmall.Size(in) == 0 || MBlocklarge.Size(jn) == 0) {
            continue;
        }
        int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
        TPZConnect::TPZDepend *depend = inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                                                           MBlocksmall.Size(in), MBlocklarge.Size(jn));
        if (blocknorm(in, jn) < 1.e-8) {
            depend->fDepMatrix.Zero();
        }
        ndepend++;
    }

    if (!ndepend) {
        for (auto jn = 0; jn < largeNumSideNodes; jn++) {
            int64_t jnodindex = large->SideConnectIndex(jn, neighbourside);
            if (MBlocklarge.Size(jn)) {
                inod.AddDependency(inodindex, jnodindex, MSL, MBlocksmall.Position(in), MBlocklarge.Position(jn),
                                   MBlocksmall.Size(in), MBlocklarge.Size(jn));
            }
            ndepend++;
        }
    }
    delete intrule;

#ifdef HUGE_DEBUG
    // restraint matrix should be equal to MSL
    {
        TPZCheckRestraint test(thisCompSide, largeCompSide);
        int64_t imsl, jmsl;
        const int64_t rmsl = MSL.Rows();
        const int64_t cmsl = MSL.Cols();
        const int64_t rtest = test.RestraintMatrix().Rows();
        const int64_t ctest = test.RestraintMatrix().Cols();

        if (rtest != rmsl || ctest != cmsl) {
            std::stringstream sout;
            sout << "Exiting - Restraint matrix side incompatibility: MSL (rows,cols): ( " << rmsl
                 << " , " << cmsl << " )" << " RestraintMatrix (rows,cols): (" << rtest << " , " << ctest << " )\n";
            LOGPZ_ERROR(logger, sout.str())
            return;
        }

        TPZFMatrix<REAL> mslc(MSL);
        mslc -= test.RestraintMatrix();

        REAL normmsl = 0.;
        for (imsl = 0; imsl < rmsl; imsl++) {
            for (jmsl = 0; jmsl < cmsl; jmsl++) {
                normmsl += sqrt(mslc(imsl, jmsl) * mslc(imsl, jmsl));
            }
        }
        if (normmsl > 1.E-6) {
            std::stringstream sout;
            sout << "TPZInterpolatedElement::Error::MSL matrix has non zero norm " << normmsl << "\n";
            mslc.Print("Difference Matrix ", sout);
            for (imsl = 0; imsl < rmsl; imsl++) {
                for (jmsl = 0; jmsl < cmsl; jmsl++) {
                    if (fabs(MSL(imsl, jmsl) - test.RestraintMatrix()(imsl, jmsl)) > 1.E-6) {
                        sout << "msl[ " << imsl << " , " << jmsl << " ] = " << MSL(imsl, jmsl) << "\t "
                             << test.RestraintMatrix()(imsl, jmsl) << std::endl;
                    }
                }
            }
            LOGPZ_ERROR(logger, sout.str())
        }

        if (test.CheckRestraint()) {
            std::stringstream sout;
            sout << "TPZInterpolatedElement::Error::Bad restraints detected\n";
            test.Print(sout);
            test.Diagnose();
            LOGPZ_ERROR(logger, sout.str())
        }
    }
#endif
}